

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<long>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<long> *out)

{
  int iVar1;
  pointer plVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  uint uVar5;
  int n;
  long lVar6;
  RepeatedField<long> *out_local;
  LogMessage local_40 [16];
  
  if (ptr == (char *)0x0) {
LAB_0016c380:
    pcVar3 = (char *)0x0;
  }
  else {
    lVar6 = (long)this->buffer_end_ - (long)ptr;
    out_local = out;
    while (uVar5 = (int)lVar6 + 0x10, (int)uVar5 < size) {
      iVar1 = RepeatedField<long>::size(out);
      RepeatedField<long>::Reserve(out,iVar1 + ((int)uVar5 >> 3));
      plVar2 = RepeatedField<long>::AddNAlreadyReserved(out,(int)uVar5 >> 3);
      memcpy(plVar2,ptr,(long)(int)(uVar5 & 0xfffffff8));
      if ((this->limit_ < 0x11) || (pcVar3 = Next(this), pcVar3 == (char *)0x0)) goto LAB_0016c380;
      size = size - (uVar5 & 0xfffffff8);
      ptr = pcVar3 + (0x10 - (ulong)(uVar5 & 7));
      lVar6 = (long)this->buffer_end_ - (long)ptr;
    }
    uVar5 = size & 0xfffffff8;
    if (7 < (uint)size) {
      n = size >> 3;
      iVar1 = RepeatedField<long>::size(out);
      RepeatedField<long>::Reserve(out,iVar1 + n);
      plVar2 = RepeatedField<long>::AddNAlreadyReserved(out,n);
      if (plVar2 == (pointer)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x4a6,0xe,"dst != nullptr");
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::
                 operator<<<google::protobuf::RepeatedField<long>_*,_0>(local_40,&out_local);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(char (*) [2])",");
        absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,n);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_40);
      }
      memcpy(plVar2,ptr,(long)(int)uVar5);
      ptr = ptr + (int)uVar5;
    }
    pcVar3 = (char *)0x0;
    if (size == uVar5) {
      pcVar3 = ptr;
    }
  }
  return pcVar3;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
  }
  int num = size / sizeof(T);
  int block_size = num * sizeof(T);
  if (num == 0) return size == block_size ? ptr : nullptr;
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
  ABSL_CHECK(dst != nullptr) << out << "," << num;
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}